

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_test.cpp
# Opt level: O2

int32_t main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  ulong uVar3;
  char *pcVar4;
  VdppCmdCfg *pVVar5;
  long *__arg;
  int32_t iVar6;
  long lVar7;
  pthread_t *ppVar8;
  int local_274;
  VdppCmdCfg vdpp_cmd_cfg;
  
  _mpp_log_l(4,"hwpq_test","in parse 3\n",0);
  local_274 = 0;
  _opterr = 0;
  vdpp_cmd_cfg.nthreads = 1;
LAB_00102327:
  do {
    iVar1 = getopt_long_only(argc,argv,"",parse_cmd(char**,int,VdppCmdCfg*)::long_options,&local_274
                            );
    if (iVar1 != 0) break;
    switch(local_274) {
    case 0:
      strncpy(vdpp_cmd_cfg.src_file_name,_optarg,0x7f);
      pcVar4 = "ssrc file name: %s\n";
      pVVar5 = &vdpp_cmd_cfg;
      goto LAB_001024ca;
    case 1:
      strncpy(vdpp_cmd_cfg.dst_file_name_y,_optarg,0x7f);
      pcVar4 = "ddst-Y file name: %s\n";
      pVVar5 = (VdppCmdCfg *)vdpp_cmd_cfg.dst_file_name_y;
      goto LAB_001024ca;
    case 2:
      strncpy(vdpp_cmd_cfg.dst_file_name_uv,_optarg,0x7f);
      pcVar4 = "ddst-UV file name: %s\n";
      pVVar5 = (VdppCmdCfg *)vdpp_cmd_cfg.dst_file_name_uv;
      goto LAB_001024ca;
    case 3:
      strncpy(vdpp_cmd_cfg.dst_file_name_hist,_optarg,0x7f);
      pcVar4 = "ddst-Hist file name: %s\n";
      pVVar5 = (VdppCmdCfg *)vdpp_cmd_cfg.dst_file_name_hist;
LAB_001024ca:
      _mpp_log_l(4,"hwpq_test",pcVar4,0,pVVar5);
      break;
    case 4:
      vdpp_cmd_cfg.img_w_i = atoi(_optarg);
      break;
    case 5:
      vdpp_cmd_cfg.img_h_i = atoi(_optarg);
      break;
    case 6:
      vdpp_cmd_cfg.img_w_i_vir = atoi(_optarg);
      break;
    case 7:
      vdpp_cmd_cfg.img_h_i_vir = atoi(_optarg);
      break;
    case 8:
      vdpp_cmd_cfg.img_w_o = atoi(_optarg);
      break;
    case 9:
      vdpp_cmd_cfg.img_h_o = atoi(_optarg);
      break;
    case 10:
      vdpp_cmd_cfg.img_w_o_vir = atoi(_optarg);
      break;
    case 0xb:
      vdpp_cmd_cfg.img_h_o_vir = atoi(_optarg);
      break;
    case 0xc:
      vdpp_cmd_cfg.uv_diff_flag = atoi(_optarg);
      break;
    case 0xd:
      vdpp_cmd_cfg.img_w_o_c = atoi(_optarg);
      break;
    case 0xe:
      vdpp_cmd_cfg.img_h_o_c = atoi(_optarg);
      break;
    case 0xf:
      vdpp_cmd_cfg.img_w_o_c_vir = atoi(_optarg);
      break;
    case 0x10:
      vdpp_cmd_cfg.img_h_o_c_vir = atoi(_optarg);
      break;
    case 0x11:
      vdpp_cmd_cfg.work_mode = atoi(_optarg);
      break;
    case 0x12:
      vdpp_cmd_cfg.nthreads = atoi(_optarg);
      if (vdpp_cmd_cfg.nthreads < 2) {
        vdpp_cmd_cfg.nthreads = 1;
      }
      break;
    case 0x13:
      vdpp_cmd_cfg.frame_num = atoi(_optarg);
    }
    _mpp_log_l(4,"hwpq_test","%s: %s",0,
               *(undefined8 *)
                (parse_cmd(char**,int,VdppCmdCfg*)::long_options + (long)local_274 * 0x20),_optarg);
  } while( true );
  if (iVar1 == -1) goto LAB_001025a6;
  goto LAB_00102327;
LAB_001025a6:
  plVar2 = (long *)mpp_osal_calloc("main");
  if (plVar2 == (long *)0x0) {
    _mpp_log_l(2,"hwpq_test","failed to alloc context for instances\n",0);
    return -4;
  }
  lVar7 = 0;
  __arg = plVar2;
  do {
    uVar3 = (ulong)vdpp_cmd_cfg.nthreads;
    if ((long)uVar3 <= lVar7) {
      ppVar8 = (pthread_t *)(plVar2 + 2);
      iVar6 = 0;
      for (lVar7 = 0; lVar7 < (int)uVar3; lVar7 = lVar7 + 1) {
        pthread_join(*ppVar8,(void **)0x0);
        uVar3 = (ulong)(uint)vdpp_cmd_cfg.nthreads;
        ppVar8 = ppVar8 + 9;
      }
      goto LAB_00102637;
    }
    *__arg = (long)&vdpp_cmd_cfg;
    *(int *)(__arg + 1) = (int)lVar7;
    iVar1 = pthread_create((pthread_t *)(__arg + 2),(pthread_attr_t *)0x0,multi_vdpp,__arg);
    lVar7 = lVar7 + 1;
    __arg = __arg + 9;
  } while (iVar1 == 0);
  _mpp_log_l(2,"hwpq_test","failed to create thread %d\n",0,(int)lVar7 + -1);
  iVar6 = -1;
LAB_00102637:
  mpp_osal_free("main",plVar2);
  return iVar6;
}

Assistant:

int32_t main(int argc, char **argv)
{
    VdppCmdCfg vdpp_cmd_cfg;
    VdppCmdCfg *p_cmd_cfg = &vdpp_cmd_cfg;
    VdppTestMultiCtxInfo *ctxs = NULL;
    int i = 0;
    int ret = 0;

    parse_cmd(argv, argc, p_cmd_cfg);

    ctxs = mpp_calloc(VdppTestMultiCtxInfo, p_cmd_cfg->nthreads);
    if (NULL == ctxs) {
        mpp_err("failed to alloc context for instances\n");
        ret = MPP_ERR_MALLOC;
        goto __RET;
    }

    for (i = 0; i < p_cmd_cfg->nthreads; i++) {
        ctxs[i].cmd = p_cmd_cfg;
        ctxs[i].chn = i;

        ret = pthread_create(&ctxs[i].thd, NULL, multi_vdpp, &ctxs[i]);
        if (ret) {
            mpp_err("failed to create thread %d\n", i);
            ret = MPP_NOK;
            goto __RET;
        }
    }

    for (i = 0; i < p_cmd_cfg->nthreads; i++)
        pthread_join(ctxs[i].thd, NULL);

__RET:
    MPP_FREE(ctxs);
    ctxs = NULL;

    return ret;
}